

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack7_24(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  auVar4 = vpbroadcastd_avx512vl();
  uVar1 = *(ulong *)(in + 1);
  uVar6 = (uint)uVar1;
  auVar8._4_4_ = uVar6;
  auVar8._0_4_ = uVar6;
  auVar8._8_4_ = uVar6;
  auVar8._12_4_ = uVar6;
  auVar5 = vpinsrd_avx(auVar8,*in,0);
  auVar8 = vpsrlvd_avx2(auVar4,_DAT_001a8e70);
  auVar4 = vpinsrd_avx(auVar4,*in >> 7,1);
  auVar4 = vpunpcklqdq_avx(auVar4,auVar8);
  auVar9._8_4_ = 0x7f;
  auVar9._0_8_ = 0x7f0000007f;
  auVar9._12_4_ = 0x7f;
  auVar4 = vpand_avx(auVar4,auVar9);
  *(undefined1 (*) [16])out = auVar4;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar1;
  auVar8 = vpshufd_avx(auVar7,0x54);
  auVar4 = vpshufd_avx(auVar5,0x54);
  auVar2 = vpsrlvd_avx2(auVar4,_DAT_001a8e80);
  auVar4 = vpinsrd_avx(auVar9,(uVar6 & 7) << 4,0);
  auVar5 = vpor_avx(auVar2,auVar4);
  auVar4 = vpand_avx(auVar2,auVar9);
  auVar4 = vpblendd_avx2(auVar4,auVar5,1);
  *(undefined1 (*) [16])(out + 4) = auVar4;
  out[8] = uVar6 >> 0x18 & 0x7f;
  auVar8 = vpsrlvd_avx2(auVar8,_DAT_001a8e90);
  auVar4 = vpinsrd_avx(auVar9,(int)(uVar1 >> 0x20) * 2 & 0x7e,0);
  auVar5 = vpor_avx(auVar8,auVar4);
  auVar4 = vpand_avx(auVar8,auVar9);
  auVar4 = vpblendd_avx2(auVar4,auVar5,1);
  *(undefined1 (*) [16])(out + 9) = auVar4;
  uVar1 = *(ulong *)(in + 3);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar1;
  auVar8 = vpshufd_avx(auVar5,0x54);
  auVar4 = vpmovsxbq_avx(ZEXT216(5));
  auVar4 = vpermi2d_avx512vl(auVar4,auVar5,auVar7);
  auVar2 = vpsrlvd_avx2(auVar4,_DAT_001a8ea0);
  auVar4 = vpinsrd_avx(auVar9,((uint)uVar1 & 3) << 5,0);
  auVar5 = vpor_avx(auVar2,auVar4);
  auVar4 = vpand_avx(auVar2,auVar9);
  auVar4 = vpblendd_avx2(auVar4,auVar5,1);
  *(undefined1 (*) [16])(out + 0xd) = auVar4;
  out[0x11] = (uint)uVar1 >> 0x17 & 0x7f;
  auVar8 = vpsrlvd_avx2(auVar8,_DAT_001a8eb0);
  uVar3 = (uint)(uVar1 >> 0x20);
  auVar4 = vpinsrd_avx(auVar9,uVar3 * 4 & 0x7c,0);
  auVar5 = vpor_avx(auVar8,auVar4);
  auVar4 = vpand_avx(auVar8,auVar9);
  auVar4 = vpblendd_avx2(auVar4,auVar5,1);
  *(undefined1 (*) [16])(out + 0x12) = auVar4;
  out[0x16] = uVar3 >> 0x1a;
  uVar6 = in[5];
  out[0x16] = uVar3 >> 0x1a | (uVar6 & 1) << 6;
  out[0x17] = uVar6 >> 1 & 0x7f;
  return in + 6;
}

Assistant:

const uint32_t *__fastunpack7_24(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 7);
  out++;
  *out = ((*in) >> 7) % (1U << 7);
  out++;
  *out = ((*in) >> 14) % (1U << 7);
  out++;
  *out = ((*in) >> 21) % (1U << 7);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 3)) << (7 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 7);
  out++;
  *out = ((*in) >> 10) % (1U << 7);
  out++;
  *out = ((*in) >> 17) % (1U << 7);
  out++;
  *out = ((*in) >> 24) % (1U << 7);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 6)) << (7 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 7);
  out++;
  *out = ((*in) >> 13) % (1U << 7);
  out++;
  *out = ((*in) >> 20) % (1U << 7);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 2)) << (7 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 7);
  out++;
  *out = ((*in) >> 9) % (1U << 7);
  out++;
  *out = ((*in) >> 16) % (1U << 7);
  out++;
  *out = ((*in) >> 23) % (1U << 7);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 5)) << (7 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 7);
  out++;
  *out = ((*in) >> 12) % (1U << 7);
  out++;
  *out = ((*in) >> 19) % (1U << 7);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 1)) << (7 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 7);
  out++;

  return in + 1;
}